

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O1

void __thiscall test_adjacency_graph_swap_Test::TestBody(test_adjacency_graph_swap_Test *this)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  pointer *__ptr;
  char *pcVar8;
  bool bVar9;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph_00;
  span<unsigned_long,_18446744073709551615UL> sVar10;
  AssertionResult gtest_ar;
  Adjacency_Graph<true> graph_0;
  Adjacency_Graph<true> graph_1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  AssertHelper local_c0;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  unsigned_long local_88;
  unsigned_long local_80;
  undefined8 uStack_78;
  long local_70;
  long lStack_68;
  undefined8 local_60;
  pair<unsigned_long,_unsigned_long> local_58;
  undefined8 uStack_48;
  long local_40;
  long lStack_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  local_58.first = 0;
  local_58.second = 1;
  uStack_48 = 1;
  local_40 = 2;
  lStack_38 = 2;
  local_30 = 3;
  local_28 = 0;
  local_20 = 3;
  edge_graph._M_len = 4;
  edge_graph._M_array = &local_58;
  Disa::Adjacency_Graph<false>::Adjacency_Graph((Adjacency_Graph<false> *)&local_88,edge_graph);
  local_b8 = (undefined1  [8])0x0;
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_a8 = 1;
  local_a0 = 2;
  local_98 = 0;
  local_90 = 2;
  edge_graph_00._M_len = 3;
  edge_graph_00._M_array = (iterator)local_b8;
  Disa::Adjacency_Graph<false>::Adjacency_Graph((Adjacency_Graph<false> *)&local_58,edge_graph_00);
  uVar6 = local_60;
  lVar5 = lStack_68;
  lVar4 = local_70;
  uVar3 = uStack_78;
  uVar2 = local_80;
  uVar1 = local_88;
  lVar7 = lStack_38 - local_40;
  bVar9 = lStack_38 != local_40;
  local_88 = local_58.first;
  local_80 = local_58.second;
  uStack_78 = uStack_48;
  local_58.first = uVar1;
  local_58.second = uVar2;
  uStack_48 = uVar3;
  local_70 = local_40;
  lStack_68 = lStack_38;
  local_60 = local_30;
  local_40 = lVar4;
  lStack_38 = lVar5;
  local_30 = uVar6;
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar9) {
    local_c8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((lVar7 >> 3) + -1);
  }
  local_c0.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_b8,"graph_0.size_vertex()","3",(unsigned_long *)&local_c8,
             (int *)&local_c0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1e8,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)((long)(local_80 - local_88) >> 3) >> 1);
  local_c0.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_b8,"graph_0.size_edge()","3",(unsigned_long *)&local_c8,
             (int *)&local_c0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1e9,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (lStack_38 != local_40) {
    local_c8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((lStack_38 - local_40 >> 3) + -1);
  }
  local_c0.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_b8,"graph_1.size_vertex()","4",(unsigned_long *)&local_c8,
             (int *)&local_c0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1ea,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)((long)(local_58.second - local_58.first) >> 3) >> 1);
  local_c0.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_b8,"graph_1.size_edge()","4",(unsigned_long *)&local_c8,
             (int *)&local_c0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1eb,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  sVar10 = Disa::Adjacency_Graph<false>::operator[]
                     ((Adjacency_Graph<false> *)&local_88,(size_t *)&local_c8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"graph_0[0][0]","1",
             ((double)CONCAT44(0x45300000,(int)(*sVar10._M_ptr >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)*sVar10._M_ptr) - 4503599627370496.0),1.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1ed,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  sVar10 = Disa::Adjacency_Graph<false>::operator[]
                     ((Adjacency_Graph<false> *)&local_88,(size_t *)&local_c8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"graph_0[0][1]","2",
             ((double)CONCAT44(0x45300000,(int)(sVar10._M_ptr[1] >> 0x20)) - 1.9342813113834067e+25)
             + ((double)CONCAT44(0x43300000,(int)sVar10._M_ptr[1]) - 4503599627370496.0),2.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1ee,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  sVar10 = Disa::Adjacency_Graph<false>::operator[]
                     ((Adjacency_Graph<false> *)&local_88,(size_t *)&local_c8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"graph_0[1][0]","0",
             ((double)CONCAT44(0x45300000,(int)(*sVar10._M_ptr >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)*sVar10._M_ptr) - 4503599627370496.0),0.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1ef,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  sVar10 = Disa::Adjacency_Graph<false>::operator[]
                     ((Adjacency_Graph<false> *)&local_88,(size_t *)&local_c8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"graph_0[1][1]","2",
             ((double)CONCAT44(0x45300000,(int)(sVar10._M_ptr[1] >> 0x20)) - 1.9342813113834067e+25)
             + ((double)CONCAT44(0x43300000,(int)sVar10._M_ptr[1]) - 4503599627370496.0),2.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1f0,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  sVar10 = Disa::Adjacency_Graph<false>::operator[]
                     ((Adjacency_Graph<false> *)&local_88,(size_t *)&local_c8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"graph_0[2][0]","0",
             ((double)CONCAT44(0x45300000,(int)(*sVar10._M_ptr >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)*sVar10._M_ptr) - 4503599627370496.0),0.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1f1,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  sVar10 = Disa::Adjacency_Graph<false>::operator[]
                     ((Adjacency_Graph<false> *)&local_88,(size_t *)&local_c8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"graph_0[2][1]","1",
             ((double)CONCAT44(0x45300000,(int)(sVar10._M_ptr[1] >> 0x20)) - 1.9342813113834067e+25)
             + ((double)CONCAT44(0x43300000,(int)sVar10._M_ptr[1]) - 4503599627370496.0),1.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1f2,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  sVar10 = Disa::Adjacency_Graph<false>::operator[]
                     ((Adjacency_Graph<false> *)&local_58,(size_t *)&local_c8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"graph_1[0][0]","1",
             ((double)CONCAT44(0x45300000,(int)(*sVar10._M_ptr >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)*sVar10._M_ptr) - 4503599627370496.0),1.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,499,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  sVar10 = Disa::Adjacency_Graph<false>::operator[]
                     ((Adjacency_Graph<false> *)&local_58,(size_t *)&local_c8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"graph_1[0][1]","3",
             ((double)CONCAT44(0x45300000,(int)(sVar10._M_ptr[1] >> 0x20)) - 1.9342813113834067e+25)
             + ((double)CONCAT44(0x43300000,(int)sVar10._M_ptr[1]) - 4503599627370496.0),3.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,500,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  sVar10 = Disa::Adjacency_Graph<false>::operator[]
                     ((Adjacency_Graph<false> *)&local_58,(size_t *)&local_c8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"graph_1[1][0]","0",
             ((double)CONCAT44(0x45300000,(int)(*sVar10._M_ptr >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)*sVar10._M_ptr) - 4503599627370496.0),0.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1f5,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  sVar10 = Disa::Adjacency_Graph<false>::operator[]
                     ((Adjacency_Graph<false> *)&local_58,(size_t *)&local_c8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"graph_1[1][1]","2",
             ((double)CONCAT44(0x45300000,(int)(sVar10._M_ptr[1] >> 0x20)) - 1.9342813113834067e+25)
             + ((double)CONCAT44(0x43300000,(int)sVar10._M_ptr[1]) - 4503599627370496.0),2.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1f6,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  sVar10 = Disa::Adjacency_Graph<false>::operator[]
                     ((Adjacency_Graph<false> *)&local_58,(size_t *)&local_c8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"graph_1[2][0]","1",
             ((double)CONCAT44(0x45300000,(int)(*sVar10._M_ptr >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)*sVar10._M_ptr) - 4503599627370496.0),1.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1f7,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  sVar10 = Disa::Adjacency_Graph<false>::operator[]
                     ((Adjacency_Graph<false> *)&local_58,(size_t *)&local_c8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"graph_1[2][1]","3",
             ((double)CONCAT44(0x45300000,(int)(sVar10._M_ptr[1] >> 0x20)) - 1.9342813113834067e+25)
             + ((double)CONCAT44(0x43300000,(int)sVar10._M_ptr[1]) - 4503599627370496.0),3.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1f8,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  sVar10 = Disa::Adjacency_Graph<false>::operator[]
                     ((Adjacency_Graph<false> *)&local_58,(size_t *)&local_c8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"graph_1[3][0]","0",
             ((double)CONCAT44(0x45300000,(int)(*sVar10._M_ptr >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)*sVar10._M_ptr) - 4503599627370496.0),0.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1f9,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  sVar10 = Disa::Adjacency_Graph<false>::operator[]
                     ((Adjacency_Graph<false> *)&local_58,(size_t *)&local_c8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"graph_1[3][1]","2",
             ((double)CONCAT44(0x45300000,(int)(sVar10._M_ptr[1] >> 0x20)) - 1.9342813113834067e+25)
             + ((double)CONCAT44(0x43300000,(int)sVar10._M_ptr[1]) - 4503599627370496.0),2.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x1fa,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  Disa::Adjacency_Graph<false>::~Adjacency_Graph((Adjacency_Graph<false> *)&local_58);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph((Adjacency_Graph<false> *)&local_88);
  return;
}

Assistant:

TEST(test_adjacency_graph, swap) {
  Adjacency_Graph<false> graph_0({{0, 1}, {1, 2}, {2, 3}, {0, 3}});  // quadrilateral graph
  Adjacency_Graph<false> graph_1({{0, 1}, {1, 2}, {0, 2}});          // 2-simplex graph

  graph_0.swap(graph_1);
  EXPECT_EQ(graph_0.size_vertex(), 3);
  EXPECT_EQ(graph_0.size_edge(), 3);
  EXPECT_EQ(graph_1.size_vertex(), 4);
  EXPECT_EQ(graph_1.size_edge(), 4);

  EXPECT_DOUBLE_EQ(graph_0[0][0], 1);
  EXPECT_DOUBLE_EQ(graph_0[0][1], 2);
  EXPECT_DOUBLE_EQ(graph_0[1][0], 0);
  EXPECT_DOUBLE_EQ(graph_0[1][1], 2);
  EXPECT_DOUBLE_EQ(graph_0[2][0], 0);
  EXPECT_DOUBLE_EQ(graph_0[2][1], 1);
  EXPECT_DOUBLE_EQ(graph_1[0][0], 1);
  EXPECT_DOUBLE_EQ(graph_1[0][1], 3);
  EXPECT_DOUBLE_EQ(graph_1[1][0], 0);
  EXPECT_DOUBLE_EQ(graph_1[1][1], 2);
  EXPECT_DOUBLE_EQ(graph_1[2][0], 1);
  EXPECT_DOUBLE_EQ(graph_1[2][1], 3);
  EXPECT_DOUBLE_EQ(graph_1[3][0], 0);
  EXPECT_DOUBLE_EQ(graph_1[3][1], 2);
}